

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

size_type __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
EraseImpl(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,map_index_t b,KeyNode *node,bool do_destroy)

{
  uint uVar1;
  NodeBase *pNVar2;
  Nonnull<const_char_*> failure_msg;
  uint uVar3;
  ulong uVar4;
  NodeBase *v1;
  NodeAndBucket NVar5;
  ViewType k;
  LogMessageFatal LStack_28;
  
  uVar3 = (this->super_UntypedMapBase).num_buckets_ - 1 & b;
  v1 = (NodeBase *)((this->super_UntypedMapBase).table_ + uVar3);
  do {
    pNVar2 = v1;
    v1 = ((NodeBase *)&pNVar2->next)->next;
    if (v1 == (NodeBase *)0x0) {
      k._M_str = (char *)node[1].super_NodeBase.next;
      k._M_len = (size_t)node[2].super_NodeBase.next;
      NVar5 = FindHelper(this,k);
      uVar3 = NVar5.bucket;
      v1 = (NodeBase *)((this->super_UntypedMapBase).table_ + uVar3);
      goto LAB_00835593;
    }
  } while (v1 != &node->super_NodeBase);
  goto LAB_008355a3;
  while (v1 != &node->super_NodeBase) {
LAB_00835593:
    pNVar2 = v1;
    v1 = ((NodeBase *)&pNVar2->next)->next;
    if (v1 == (NodeBase *)0x0) break;
  }
LAB_008355a3:
  if (v1 != &node->super_NodeBase) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (v1,node,"*prev == node");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x2d4,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  ((NodeBase *)&pNVar2->next)->next = v1->next;
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
  if ((uVar3 == (this->super_UntypedMapBase).index_of_first_non_null_) &&
     (uVar1 = (this->super_UntypedMapBase).num_buckets_, uVar3 < uVar1)) {
    uVar4 = (ulong)uVar3;
    do {
      if ((this->super_UntypedMapBase).table_[uVar4] != (NodeBase *)0x0) break;
      uVar4 = uVar4 + 1;
      (this->super_UntypedMapBase).index_of_first_non_null_ = (map_index_t)uVar4;
    } while (uVar1 != uVar4);
  }
  if (do_destroy && (this->super_UntypedMapBase).arena_ == (Arena *)0x0) {
    UntypedMapBase::DeleteNode(&this->super_UntypedMapBase,&node->super_NodeBase);
  }
  return 1;
}

Assistant:

PROTOBUF_NOINLINE size_type EraseImpl(map_index_t b, KeyNode* node,
                                        bool do_destroy) {
    // Force bucket_index to be in range.
    b &= (num_buckets_ - 1);

    const auto find_prev = [&] {
      NodeBase** prev = table_ + b;
      for (; *prev != nullptr && *prev != node; prev = &(*prev)->next) {
      }
      return prev;
    };

    NodeBase** prev = find_prev();
    if (*prev == nullptr) {
      // The bucket index is wrong. The table was modified since the iterator
      // was made, so let's find the new bucket.
      b = FindHelper(TS::ToView(node->key())).bucket;
      prev = find_prev();
    }
    ABSL_DCHECK_EQ(*prev, node);
    *prev = (*prev)->next;

    --num_elements_;
    if (ABSL_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             table_[index_of_first_non_null_] == nullptr) {
        ++index_of_first_non_null_;
      }
    }

    if (arena() == nullptr && do_destroy) {
      DeleteNode(node);
    }

    // To allow for the other overload of EraseImpl to do a tail call.
    return 1;
  }